

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void HE16_SSE2(uint8_t *dst)

{
  uint8_t uVar1;
  __m128i values;
  int j;
  uint8_t *dst_local;
  
  dst_local = dst;
  for (j = 0x10; 0 < j; j = j + -1) {
    uVar1 = dst_local[-1];
    *(ulong *)dst_local =
         CONCAT17(uVar1,CONCAT16(uVar1,CONCAT15(uVar1,CONCAT14(uVar1,CONCAT13(uVar1,CONCAT12(uVar1,
                                                  CONCAT11(uVar1,uVar1)))))));
    *(ulong *)(dst_local + 8) =
         CONCAT17(uVar1,CONCAT16(uVar1,CONCAT15(uVar1,CONCAT14(uVar1,CONCAT13(uVar1,CONCAT12(uVar1,
                                                  CONCAT11(uVar1,uVar1)))))));
    dst_local = dst_local + 0x20;
  }
  return;
}

Assistant:

static void HE16_SSE2(uint8_t* dst) {     // horizontal
  int j;
  for (j = 16; j > 0; --j) {
    const __m128i values = _mm_set1_epi8(dst[-1]);
    _mm_storeu_si128((__m128i*)dst, values);
    dst += BPS;
  }
}